

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptJumpStatement(HlslGrammar *this,TIntermNode **statement)

{
  bool bVar1;
  EHlslTokenClass EVar2;
  TIntermTyped *in_RAX;
  TIntermBranch *pTVar3;
  TOperator branchOp;
  char *syntax;
  TIntermediate *this_00;
  uint uVar4;
  TIntermTyped *node;
  
  node = in_RAX;
  EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  uVar4 = EVar2 - EHTokBreak;
  if (5 < uVar4) {
    return false;
  }
  if ((0x33U >> (uVar4 & 0x1f) & 1) == 0) {
    return false;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  switch(uVar4) {
  case 0:
    pTVar3 = TIntermediate::addBranch
                       (this->intermediate,EOpBreak,&(this->super_HlslTokenStream).token.loc);
    *statement = &pTVar3->super_TIntermNode;
    if (((this->parseContext->super_TParseContextBase).loopNestingLevel == 0) &&
       ((this->parseContext->super_TParseContextBase).switchSequenceStack.
        super_list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
        .
        super__List_base<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
        ._M_impl._M_node._M_size == 0)) {
      syntax = "loop or switch";
LAB_003abc54:
      expected(this,syntax);
      return false;
    }
    goto LAB_003abc74;
  case 1:
    pTVar3 = TIntermediate::addBranch
                       (this->intermediate,EOpContinue,&(this->super_HlslTokenStream).token.loc);
    *statement = &pTVar3->super_TIntermNode;
    if ((this->parseContext->super_TParseContextBase).loopNestingLevel == 0) {
      syntax = "loop";
      goto LAB_003abc54;
    }
    goto LAB_003abc74;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslGrammar.cpp"
                  ,0x106c,"bool glslang::HlslGrammar::acceptJumpStatement(TIntermNode *&)");
  case 4:
    this_00 = this->intermediate;
    branchOp = EOpKill;
LAB_003abc6c:
    pTVar3 = TIntermediate::addBranch(this_00,branchOp,&(this->super_HlslTokenStream).token.loc);
    break;
  case 5:
    bVar1 = acceptExpression(this,&node);
    if (!bVar1) {
      this_00 = this->intermediate;
      branchOp = EOpReturn;
      goto LAB_003abc6c;
    }
    pTVar3 = (TIntermBranch *)
             HlslParseContext::handleReturnValue
                       (this->parseContext,&(this->super_HlslTokenStream).token.loc,node);
  }
  *statement = &pTVar3->super_TIntermNode;
LAB_003abc74:
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
  if (!bVar1) {
    expected(this,";");
  }
  return true;
}

Assistant:

bool HlslGrammar::acceptJumpStatement(TIntermNode*& statement)
{
    EHlslTokenClass jump = peek();
    switch (jump) {
    case EHTokContinue:
    case EHTokBreak:
    case EHTokDiscard:
    case EHTokReturn:
        advanceToken();
        break;
    default:
        // not something we handle in this function
        return false;
    }

    switch (jump) {
    case EHTokContinue:
        statement = intermediate.addBranch(EOpContinue, token.loc);
        if (parseContext.loopNestingLevel == 0) {
            expected("loop");
            return false;
        }
        break;
    case EHTokBreak:
        statement = intermediate.addBranch(EOpBreak, token.loc);
        if (parseContext.loopNestingLevel == 0 && parseContext.switchSequenceStack.size() == 0) {
            expected("loop or switch");
            return false;
        }
        break;
    case EHTokDiscard:
        statement = intermediate.addBranch(EOpKill, token.loc);
        break;

    case EHTokReturn:
    {
        // expression
        TIntermTyped* node;
        if (acceptExpression(node)) {
            // hook it up
            statement = parseContext.handleReturnValue(token.loc, node);
        } else
            statement = intermediate.addBranch(EOpReturn, token.loc);
        break;
    }

    default:
        assert(0);
        return false;
    }

    // SEMICOLON
    if (! acceptTokenClass(EHTokSemicolon))
        expected(";");

    return true;
}